

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

xmlTextWriterPtr xmlNewTextWriterMemory(xmlBufferPtr buf,int compression)

{
  xmlOutputBufferPtr out;
  xmlTextWriterPtr pxVar1;
  
  pxVar1 = (xmlTextWriterPtr)0x0;
  out = xmlOutputBufferCreateBuffer(buf,(xmlCharEncodingHandlerPtr)0x0);
  if (out == (xmlOutputBufferPtr)0x0) {
    xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (xmlNode *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,0,0,"%s","xmlNewTextWriterMemory : out of memory!\n");
  }
  else {
    pxVar1 = xmlNewTextWriter(out);
    if (pxVar1 == (xmlTextWriterPtr)0x0) {
      pxVar1 = (xmlTextWriterPtr)0x0;
      xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (xmlNode *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","xmlNewTextWriterMemory : out of memory!\n");
      xmlOutputBufferClose(out);
    }
  }
  return pxVar1;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterMemory(xmlBufferPtr buf, int compression ATTRIBUTE_UNUSED)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

/*::todo handle compression */
    out = xmlOutputBufferCreateBuffer(buf, NULL);

    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterMemory : out of memory!\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterMemory : out of memory!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    return ret;
}